

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O0

bool Kumu::PathResolveLinks(string *link_path,string *resolved_path,char separator)

{
  bool bVar1;
  reference pbVar2;
  char *pcVar3;
  ssize_t sVar4;
  int *piVar5;
  ILogSink *this;
  undefined8 uVar6;
  bool local_5ca;
  string local_5c8;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  string local_560;
  string local_540;
  allocator<char> local_519;
  string local_518;
  undefined1 local_4f8 [8];
  string tmp_path;
  ssize_t link_size;
  string next_link;
  char local_498 [8];
  char link_buf [1024];
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  iterator i;
  string local_78;
  undefined1 local_58 [8];
  PathCompList_t out_list;
  PathCompList_t in_list;
  char separator_local;
  string *resolved_path_local;
  string *link_path_local;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&out_list.
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node._M_size);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_58);
  PathMakeCanonical(&local_78,link_path,'/');
  PathToComponents(&local_78,
                   (PathCompList_t *)
                   &out_list.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node._M_size,separator);
  std::__cxx11::string::~string((string *)&local_78);
  std::
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  _List_iterator(&local_90);
  local_90._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&out_list.
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node._M_size);
  while( true ) {
    next_link.field_2._8_8_ =
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&out_list.
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node._M_size);
    bVar1 = std::operator!=(&local_90,(_Self *)((long)&next_link.field_2 + 8));
    if (!bVar1) break;
    pbVar2 = std::
             _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_90);
    bVar1 = std::operator!=(pbVar2,"..");
    local_5ca = false;
    if (bVar1) {
      pbVar2 = std::
               _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_90);
      local_5ca = std::operator!=(pbVar2,".");
    }
    if (local_5ca == false) {
      __assert_fail("*i != \"..\" && *i != \".\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_fileio.cpp"
                    ,0x1d5,"bool Kumu::PathResolveLinks(const std::string &, std::string &, char)");
    }
    pbVar2 = std::
             _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_90);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58,pbVar2);
    do {
      ComponentsToAbsolutePath((string *)&link_size,(PathCompList_t *)local_58,separator);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      sVar4 = readlink(pcVar3,local_498,0x400);
      if (sVar4 == -1) {
        piVar5 = __errno_location();
        if (*piVar5 == 0x16) {
          tmp_path.field_2._12_4_ = 5;
        }
        else {
          this = DefaultLogSink();
          uVar6 = std::__cxx11::string::c_str();
          piVar5 = __errno_location();
          pcVar3 = strerror(*piVar5);
          ILogSink::Error(this,"%s: readlink: %s\n",uVar6,pcVar3);
          link_path_local._7_1_ = 0;
          tmp_path.field_2._12_4_ = 1;
        }
      }
      else {
        if (0x3ff < sVar4) {
          __assert_fail("link_size < MaxFilePath",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_fileio.cpp"
                        ,0x1e6,
                        "bool Kumu::PathResolveLinks(const std::string &, std::string &, char)");
        }
        local_498[sVar4] = '\0';
        std::__cxx11::string::string((string *)local_4f8);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_518,local_498,&local_519);
        bVar1 = PathIsAbsolute(&local_518,'/');
        std::__cxx11::string::~string((string *)&local_518);
        std::allocator<char>::~allocator(&local_519);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)local_4f8,local_498);
        }
        else {
          PathDirname(&local_560,(string *)&link_size,'/');
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_580,local_498,&local_581);
          PathJoin(&local_540,&local_560,&local_580,'/');
          std::__cxx11::string::operator=((string *)local_4f8,(string *)&local_540);
          std::__cxx11::string::~string((string *)&local_540);
          std::__cxx11::string::~string((string *)&local_580);
          std::allocator<char>::~allocator(&local_581);
          std::__cxx11::string::~string((string *)&local_560);
        }
        PathMakeCanonical(&local_5a8,(string *)local_4f8,'/');
        PathToComponents(&local_5a8,(PathCompList_t *)local_58,separator);
        std::__cxx11::string::~string((string *)&local_5a8);
        std::__cxx11::string::~string((string *)local_4f8);
        tmp_path.field_2._12_4_ = 0;
      }
      std::__cxx11::string::~string((string *)&link_size);
    } while (tmp_path.field_2._12_4_ == 0);
    if (tmp_path.field_2._12_4_ != 5) goto LAB_001249c3;
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_90);
  }
  ComponentsToAbsolutePath(&local_5c8,(PathCompList_t *)local_58,separator);
  std::__cxx11::string::operator=((string *)resolved_path,(string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5c8);
  link_path_local._7_1_ = 1;
  tmp_path.field_2._12_4_ = 1;
LAB_001249c3:
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_58);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&out_list.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size);
  return (bool)(link_path_local._7_1_ & 1);
}

Assistant:

bool
Kumu::PathResolveLinks(const std::string& link_path, std::string& resolved_path, char separator)
{
  PathCompList_t in_list, out_list;
  PathToComponents(PathMakeCanonical(link_path), in_list, separator);
  PathCompList_t::iterator i;
  char link_buf[MaxFilePath];

  for ( i = in_list.begin(); i != in_list.end(); ++i )
    {
      assert ( *i != ".." && *i != "." );
      out_list.push_back(*i);

      for (;;)
	{
	  std::string next_link = ComponentsToAbsolutePath(out_list, separator);
	  ssize_t link_size = readlink(next_link.c_str(), link_buf, MaxFilePath);

	  if ( link_size == -1 )
	    {
	      if ( errno == EINVAL )
		break;

	      DefaultLogSink().Error("%s: readlink: %s\n", next_link.c_str(), strerror(errno));
	      return false;
	    }
	  
	  assert(link_size < MaxFilePath);
	  link_buf[link_size] = 0;
	  std::string tmp_path;
	  out_list.clear();

	  if ( PathIsAbsolute(link_buf) )
	    {
	      tmp_path = link_buf;
	    }
	  else
	    {
	      tmp_path = PathJoin(PathDirname(next_link), link_buf);
	    }

	  PathToComponents(PathMakeCanonical(tmp_path), out_list, separator);
	}
    }

  resolved_path = ComponentsToAbsolutePath(out_list, separator);
  return true;
}